

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O3

string * __thiscall
duckdb::FixedDecimalStatistics::GetStats_abi_cxx11_
          (string *__return_storage_ptr__,FixedDecimalStatistics *this,hugeint_t *input)

{
  pointer pcVar1;
  data_ptr_t in_RCX;
  hugeint_t input_00;
  size_type __dnew;
  data_t buffer [16];
  size_type local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  input_00.upper = (int64_t)&local_28;
  input_00.lower = input->upper;
  WriteParquetDecimal((duckdb *)input->lower,input_00,in_RCX);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_30 = 0x10;
  pcVar1 = (pointer)std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30;
  *(undefined8 *)pcVar1 = local_28;
  *(undefined8 *)(pcVar1 + 8) = uStack_20;
  __return_storage_ptr__->_M_string_length = local_30;
  (__return_storage_ptr__->_M_dataplus)._M_p[local_30] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string GetStats(hugeint_t &input) {
		data_t buffer[16];
		WriteParquetDecimal(input, buffer);
		return string(const_char_ptr_cast(buffer), 16);
	}